

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void anon_unknown.dwarf_4bf6b6::AddEvaluationFile
               (string *inputName,string *targetName,string *outputExpr,string *condition,
               bool inputIsContent,string *newLineCharacter,mode_t permissions,
               cmExecutionStatus *status)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  cmMakefile *this_00;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_f8;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_f0;
  string local_e8 [32];
  undefined1 local_c8 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  conditionCge;
  undefined1 local_b0 [8];
  cmGeneratorExpression conditionGe;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  outputCge;
  cmListFileBacktrace local_68;
  undefined1 local_58 [8];
  cmGeneratorExpression outputGe;
  cmListFileBacktrace lfbt;
  string *newLineCharacter_local;
  bool inputIsContent_local;
  string *condition_local;
  string *outputExpr_local;
  string *targetName_local;
  string *inputName_local;
  
  cmExecutionStatus::GetMakefile(status);
  this = &outputGe.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  cmMakefile::GetBacktrace((cmMakefile *)this);
  cmListFileBacktrace::cmListFileBacktrace(&local_68,(cmListFileBacktrace *)this);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_58,&local_68);
  cmListFileBacktrace::~cmListFileBacktrace(&local_68);
  std::__cxx11::string::string
            ((string *)
             &conditionGe.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(string *)outputExpr);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&stack0xffffffffffffff80,(string *)local_58)
  ;
  std::__cxx11::string::~string
            ((string *)
             &conditionGe.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  cmListFileBacktrace::cmListFileBacktrace
            ((cmListFileBacktrace *)&conditionCge,
             (cmListFileBacktrace *)
             &outputGe.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_b0,(cmListFileBacktrace *)&conditionCge);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&conditionCge);
  std::__cxx11::string::string(local_e8,(string *)condition);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c8,(string *)local_b0);
  std::__cxx11::string::~string(local_e8);
  this_00 = cmExecutionStatus::GetMakefile(status);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  unique_ptr(&local_f0,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)&stack0xffffffffffffff80);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  unique_ptr(&local_f8,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)local_c8);
  cmMakefile::AddEvaluationFile
            (this_00,inputName,targetName,&local_f0,&local_f8,newLineCharacter,permissions,
             inputIsContent);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_f8);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_f0);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_c8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_b0);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&stack0xffffffffffffff80);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_58);
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)
             &outputGe.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void AddEvaluationFile(const std::string& inputName,
                       const std::string& targetName,
                       const std::string& outputExpr,
                       const std::string& condition, bool inputIsContent,
                       const std::string& newLineCharacter, mode_t permissions,
                       cmExecutionStatus& status)
{
  cmListFileBacktrace lfbt = status.GetMakefile().GetBacktrace();

  cmGeneratorExpression outputGe(lfbt);
  std::unique_ptr<cmCompiledGeneratorExpression> outputCge =
    outputGe.Parse(outputExpr);

  cmGeneratorExpression conditionGe(lfbt);
  std::unique_ptr<cmCompiledGeneratorExpression> conditionCge =
    conditionGe.Parse(condition);

  status.GetMakefile().AddEvaluationFile(
    inputName, targetName, std::move(outputCge), std::move(conditionCge),
    newLineCharacter, permissions, inputIsContent);
}